

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# properties.cc
# Opt level: O0

void __thiscall gutil::Properties::saveOctave(Properties *this,ostream *out,char *comment)

{
  bool bVar1;
  ostream *poVar2;
  char *in_RDX;
  ostream *in_RSI;
  const_iterator it;
  shared_ptr<gutil::PropertyNode> root;
  ostream *in_stack_000001d8;
  PropertyNode *in_stack_000001e0;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *in_stack_ffffffffffffff58;
  _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_ffffffffffffff60;
  string *this_00;
  _Self local_68;
  _Self local_60 [3];
  string local_48 [24];
  string *in_stack_ffffffffffffffd0;
  string *in_stack_ffffffffffffffd8;
  PropertyNode *in_stack_ffffffffffffffe0;
  char *local_18;
  
  local_18 = in_RDX;
  if (in_RDX == (char *)0x0) {
    local_18 = "Converted properties";
  }
  this_00 = local_48;
  std::__cxx11::string::string(this_00);
  std::make_shared<gutil::PropertyNode,std::__cxx11::string>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_00);
  std::__cxx11::string::~string(local_48);
  local_60[0]._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
       ::begin(in_stack_ffffffffffffff58);
  while( true ) {
    local_68._M_node =
         (_Base_ptr)
         std::
         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
         ::end(in_stack_ffffffffffffff58);
    bVar1 = std::operator!=(local_60,&local_68);
    if (!bVar1) break;
    std::__shared_ptr_access<gutil::PropertyNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<gutil::PropertyNode,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
               )0x1a77d6);
    std::
    _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::operator->((_Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)0x1a77ea);
    std::
    _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::operator->((_Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)0x1a77f9);
    PropertyNode::addChild
              (in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0);
    std::
    _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::operator++(in_stack_ffffffffffffff60);
  }
  poVar2 = std::operator<<(in_RSI,"# ");
  poVar2 = std::operator<<(poVar2,local_18);
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  std::__shared_ptr_access<gutil::PropertyNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<gutil::PropertyNode,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             0x1a78ad);
  PropertyNode::saveOctave(in_stack_000001e0,in_stack_000001d8);
  std::shared_ptr<gutil::PropertyNode>::~shared_ptr((shared_ptr<gutil::PropertyNode> *)0x1a78cc);
  return;
}

Assistant:

void Properties::saveOctave(std::ostream& out, const char *comment) const
{
  if (comment == 0)
  {
    comment="Converted properties";
  }

  std::shared_ptr<PropertyNode> root=std::make_shared<PropertyNode>(std::string());

  for (std::map<std::string, std::string>::const_iterator it=data.begin(); it!=data.end(); ++it)
  {
    root->addChild(it->first, it->second);
  }

  out << "# " << comment << std::endl;
  root->saveOctave(out);
}